

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2610_write(void *chip,UINT8 a,UINT8 v)

{
  undefined1 auVar1 [16];
  byte *pbVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  long lVar7;
  
  switch(a & 3) {
  case 0:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 0;
    if (v < 0x10) {
LAB_00134857:
      (**(code **)((long)chip + 0x660))(*(undefined8 *)((long)chip + 0x678),a,v);
      return;
    }
    break;
  case 1:
    if (*(char *)((long)chip + 0x5108) == '\0') {
      bVar4 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar4 + 8) = v;
      if ((bVar4 & 0xf0) == 0x20) {
        ym2610b_update_one(chip,0,(DEV_SMPL **)0x0);
        OPNWriteMode((FM_OPN *)((long)chip + 0x208),(uint)bVar4,(uint)v);
        return;
      }
      uVar5 = (uint)bVar4;
      if ((bVar4 & 0xf0) == 0x10) {
        ym2610b_update_one(chip,0,(DEV_SMPL **)0x0);
        auVar1 = _DAT_001769f0;
        if (uVar5 < 0x1d) {
          if ((0xe3f0000U >> (uVar5 & 0x1f) & 1) != 0) {
            YM_DELTAT_ADPCM_Write((YM_DELTAT *)((long)chip + 0x5368),bVar4 - 0x10,(uint)v);
            return;
          }
          if (uVar5 == 0x1c) {
            bVar4 = ~v;
            pbVar2 = (byte *)((long)chip + 0x5161);
            lVar3 = 0;
            auVar6 = _DAT_001769e0;
            do {
              if (SUB164(auVar6 ^ auVar1,4) == -0x80000000 &&
                  SUB164(auVar6 ^ auVar1,0) < -0x7ffffffa) {
                pbVar2[-0x40] = (byte)(1 << ((byte)lVar3 & 0x1f)) & bVar4;
                *pbVar2 = (byte)(2 << ((byte)lVar3 & 0x1f)) & bVar4;
              }
              lVar3 = lVar3 + 2;
              lVar7 = auVar6._8_8_;
              auVar6._0_8_ = auVar6._0_8_ + 2;
              auVar6._8_8_ = lVar7 + 2;
              pbVar2 = pbVar2 + 0x80;
            } while (lVar3 != 6);
            *(byte *)((long)chip + 0x53f0) = bVar4 & 0x80;
            *(byte *)((long)chip + 0x5360) = *(byte *)((long)chip + 0x5360) & bVar4;
            return;
          }
        }
        emu_logf((DEV_LOGGER *)((long)chip + 0x4760),'\x02',
                 "write to unknown deltat register %02x val=%02x\n",(ulong)bVar4,v);
        return;
      }
      if ((bVar4 & 0xf0) != 0) {
        ym2610b_update_one(chip,0,(DEV_SMPL **)0x0);
        uVar5 = (uint)bVar4;
        goto LAB_0013492b;
      }
      goto LAB_00134857;
    }
    break;
  case 2:
    *(UINT8 *)((long)chip + 0x22c) = v;
    *(undefined1 *)((long)chip + 0x5108) = 1;
    break;
  case 3:
    if (*(char *)((long)chip + 0x5108) == '\x01') {
      ym2610b_update_one(chip,0,(DEV_SMPL **)0x0);
      bVar4 = *(byte *)((long)chip + 0x22c);
      *(UINT8 *)((long)chip + (ulong)bVar4 + 0x108) = v;
      if (bVar4 < 0x30) {
        FM_ADPCMAWrite((YM2610 *)chip,(uint)bVar4,(uint)v);
        return;
      }
      uVar5 = bVar4 + 0x100;
LAB_0013492b:
      OPNWriteReg((FM_OPN *)((long)chip + 0x208),uVar5,(uint)v);
      return;
    }
  }
  return;
}

Assistant:

void ym2610_write(void *chip, UINT8 a, UINT8 v)
{
	YM2610 *F2610 = (YM2610 *)chip;
	FM_OPN *OPN   = &F2610->OPN;
	int addr;
	int ch;

	//v &= 0xff;  /* adjust to 8 bit bus */

	switch( a&3 )
	{
	case 0: /* address port 0 */
		OPN->ST.address = v;
		F2610->addr_A1 = 0;

		/* Write register to SSG emulator */
		if( v < 16 ) OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
		break;

	case 1: /* data port 0    */
		if (F2610->addr_A1 != 0)
			break;  /* verified on real YM2608 */

		addr = OPN->ST.address;
		F2610->REGS[addr] = v;
		switch(addr & 0xf0)
		{
		case 0x00:  /* SSG section */
			/* Write data to SSG emulator */
			OPN->ST.SSG_funcs.write(OPN->ST.SSG_param,a,v);
			break;
		case 0x10: /* DeltaT ADPCM */
			ym2610_update_req(F2610);

			switch(addr)
			{
			case 0x10:  /* control 1 */
			case 0x11:  /* control 2 */
			case 0x12:  /* start address L */
			case 0x13:  /* start address H */
			case 0x14:  /* stop address L */
			case 0x15:  /* stop address H */

			case 0x19:  /* delta-n L */
			case 0x1a:  /* delta-n H */
			case 0x1b:  /* volume */
				{
					YM_DELTAT_ADPCM_Write(&F2610->deltaT,addr-0x10,v);
				}
				break;

			case 0x1c: /*  FLAG CONTROL : Extend Status Clear/Mask */
				{
					UINT8 statusmask = ~v;
					/* set arrived flag mask */
					for(ch=0;ch<6;ch++)
						F2610->adpcm[ch].flagMask = statusmask&(1<<ch);

					F2610->deltaT.status_change_EOS_bit = statusmask & 0x80;    /* status flag: set bit7 on End Of Sample */

					/* clear arrived flag */
					F2610->adpcm_arrivedEndAddress &= statusmask;
				}
				break;

			default:
				emu_logf(&F2610->OPN.logger, DEVLOG_WARN, "write to unknown deltat register %02x val=%02x\n",addr,v);
				break;
			}

			break;
		case 0x20:  /* Mode Register */
			ym2610_update_req(F2610);
			OPNWriteMode(OPN,addr,v);
			break;
		default:    /* OPN section */
			ym2610_update_req(F2610);
			/* write register */
			OPNWriteReg(OPN,addr,v);
		}
		break;

	case 2: /* address port 1 */
		OPN->ST.address = v;
		F2610->addr_A1 = 1;
		break;

	case 3: /* data port 1    */
		if (F2610->addr_A1 != 1)
			break;  /* verified on real YM2608 */

		ym2610_update_req(F2610);
		addr = OPN->ST.address;
		F2610->REGS[addr | 0x100] = v;
		if( addr < 0x30 )
			/* 100-12f : ADPCM A section */
			FM_ADPCMAWrite(F2610,addr,v);
		else
			OPNWriteReg(OPN,addr | 0x100,v);
	}
	//return OPN->ST.irq;
	return;
}